

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::AddNotDefinedError(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,std::basic_string_view<char,std::char_traits<char>>)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  anon_class_8_1_8991fb9c *o;
  VoidPtr ptr_local;
  
  std::
  invoke_abi_cxx11_<google::protobuf::DescriptorBuilder::AddNotDefinedError(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,std::basic_string_view<char,std::char_traits<char>>)::__1_const&>
            (__return_storage_ptr__,(anon_class_8_1_8991fb9c *)this);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}